

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::ResourceQueryBufferLimitCase::iterate
          (ResourceQueryBufferLimitCase *this)

{
  char cVar1;
  int iVar2;
  Context *this_00;
  RenderContext *renderCtx;
  TestLog *pTVar3;
  int iVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  TestError *pTVar7;
  char *in_RCX;
  char *description;
  long lVar8;
  GLsizei *pGVar9;
  ostringstream *poVar10;
  GLsizei written;
  int local_2dc;
  int params [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  long local_2b0;
  ScopedLogSection section;
  undefined4 local_2a0;
  undefined4 uStack_29c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  ScopedLogSection section_1;
  undefined1 local_280 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270 [3];
  ios_base local_208 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f0;
  undefined1 local_1d0 [208];
  ShaderProgram program;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_2b0 = CONCAT44(extraout_var,iVar5);
  this_00 = (this->super_TestCase).m_context;
  renderCtx = this_00->m_renderCtx;
  local_1d0[0x10] = 0;
  local_1d0._17_8_ = 0;
  local_1d0._0_8_ = (pointer)0x0;
  local_1d0[8] = 0;
  local_1d0._9_7_ = 0;
  memset(local_280,0,0xac);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)&section,(_anonymous_namespace_ *)this_00,
             (Context *)
             "${GLSL_VERSION_DECL}\nlayout(local_size_x = 1) in;\nuniform highp int u_uniform;\nwriteonly buffer OutputBufferBlock { highp int b_output_int; };\nvoid main ()\n{\n\tb_output_int = u_uniform;\n}\n"
             ,in_RCX);
  params[0] = 5;
  params._8_8_ = local_2c8._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(params + 2),section.m_log,
             (long)&(section.m_log)->m_log + CONCAT44(uStack_29c,local_2a0));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + (params._0_8_ & 0xffffffff) * 0x18),(value_type *)(params + 2));
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)local_280);
  if ((char *)params._8_8_ != local_2c8._M_local_buf + 8) {
    operator_delete((void *)params._8_8_,local_2c8._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)section.m_log != &local_298) {
    operator_delete(section.m_log,local_298._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f0);
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_280._0_8_ = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"Program","");
  params._0_8_ = &local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)params,"Program","");
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar3,(string *)local_280,(string *)params);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)params._0_8_ != &local_2c8) {
    operator_delete((void *)params._0_8_,local_2c8._M_allocated_capacity + 1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280._0_8_ !=
      local_270) {
    operator_delete((void *)local_280._0_8_,(ulong)(local_270[0]._M_dataplus._M_p + 1));
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  if (program.m_program.m_info.linkOk == false) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    local_280._0_8_ = local_270;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,"could not build program","");
    tcu::TestError::TestError(pTVar7,(string *)local_280);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  tcu::TestLog::endSection(section.m_log);
  local_2dc = (**(code **)(local_2b0 + 0x9a8))(program.m_program.m_program,0x92e1,"u_uniform");
  dVar6 = (**(code **)(local_2b0 + 0x800))();
  glu::checkError(dVar6,"query resource index",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                  ,0x644);
  if (local_2dc == -1) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    local_280._0_8_ = local_270;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,"Uniform u_uniform resource index was GL_INVALID_INDEX","");
    tcu::TestError::TestError(pTVar7,(string *)local_280);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  lVar8 = 0x10;
  do {
    poVar10 = (ostringstream *)(local_280 + 8);
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_280._0_8_ = local_270;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"QueryToLarger","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)params,*(char **)((long)&PTR_typeinfo_name_00b52630 + lVar8),
               (allocator<char> *)&section);
    tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar3,(string *)local_280,(string *)params);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)params._0_8_ != &local_2c8) {
      operator_delete((void *)params._0_8_,local_2c8._M_allocated_capacity + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280._0_8_ !=
        local_270) {
      operator_delete((void *)local_280._0_8_,(ulong)(local_270[0]._M_dataplus._M_p + 1));
    }
    section.m_log = (TestLog *)0x930e0000930e;
    iVar5 = *(int *)((long)&PTR_typeinfo_00b52638 + lVar8);
    iVar2 = *(int *)((long)&PTR_typeinfo_00b52638 + lVar8 + 4);
    iVar4 = iVar5;
    if (iVar2 < iVar5) {
      iVar4 = iVar2;
    }
    params[0] = 0xff;
    params[1] = 0xff;
    params[2] = 0xff;
    params[3] = 0xff;
    written = -1;
    local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"Querying ",9);
    std::ostream::operator<<(poVar10,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar10," uniform prop(s) to a buffer with size ",0x27);
    std::ostream::operator<<(poVar10,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar10,". Expecting query to return ",0x1c);
    std::ostream::operator<<(poVar10,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10," prop(s)",8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar10);
    std::ios_base::~ios_base(local_208);
    cVar1 = *(char *)((long)&iterate::querySizes[0].description + lVar8);
    pGVar9 = (GLsizei *)0x0;
    if (cVar1 != '\0') {
      pGVar9 = &written;
    }
    (**(code **)(local_2b0 + 0x9c8))
              (program.m_program.m_program,0x92e1,local_2dc,iVar5,&section,iVar2,pGVar9,
               (string *)params);
    dVar6 = (**(code **)(local_2b0 + 0x800))();
    glu::checkError(dVar6,"query program resources",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                    ,0x66d);
    if ((cVar1 == '\0') || (written == iVar4)) {
      if (params[iVar4] != 0xff) {
        local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar10 = (ostringstream *)(local_280 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar10,"Error, guard at index ",0x16);
        std::ostream::operator<<(poVar10,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar10," was modified. Was 255 before call, got dec=",0x2c);
        std::ostream::operator<<(poVar10,params[iVar4]);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar10);
        std::ios_base::~ios_base(local_208);
        description = "Wrote over buffer size";
        goto LAB_00526a31;
      }
    }
    else {
      local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar10 = (ostringstream *)(local_280 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar10,"Error, expected write length of ",0x20);
      std::ostream::operator<<(poVar10,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,", got ",6);
      std::ostream::operator<<(poVar10,written);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar10);
      std::ios_base::~ios_base(local_208);
      description = "Unexpected write lenght";
LAB_00526a31:
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 description);
    }
    tcu::TestLog::endSection(section_1.m_log);
    lVar8 = lVar8 + 0x18;
    if (lVar8 == 0xa0) {
      glu::ShaderProgram::~ShaderProgram(&program);
      return STOP;
    }
  } while( true );
}

Assistant:

ResourceQueryBufferLimitCase::IterateResult ResourceQueryBufferLimitCase::iterate (void)
{
	static const char* const computeSource =	"${GLSL_VERSION_DECL}\n"
												"layout(local_size_x = 1) in;\n"
												"uniform highp int u_uniform;\n"
												"writeonly buffer OutputBufferBlock { highp int b_output_int; };\n"
												"void main ()\n"
												"{\n"
												"	b_output_int = u_uniform;\n"
												"}\n";

	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	const glu::ShaderProgram	program			(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(specializeShader(m_context, computeSource)));
	glw::GLuint					uniformIndex;

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Log program
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Program", "Program");

		m_testCtx.getLog() << program;
		if (!program.isOk())
			throw tcu::TestError("could not build program");
	}

	uniformIndex = gl.getProgramResourceIndex(program.getProgram(), GL_UNIFORM, "u_uniform");
	GLU_EXPECT_NO_ERROR(gl.getError(), "query resource index");

	if (uniformIndex == GL_INVALID_INDEX)
		throw tcu::TestError("Uniform u_uniform resource index was GL_INVALID_INDEX");

	// Query uniform properties

	{
		static const struct
		{
			const char*	description;
			int			numProps;
			int			bufferSize;
			bool		returnLength;
		} querySizes[] =
		{
			{ "Query to a larger buffer",							2, 3, true	},
			{ "Query to too small a buffer",						3, 2, true	},
			{ "Query to zero sized buffer",							3, 0, true	},
			{ "Query to a larger buffer, null length argument",		2, 3, false	},
			{ "Query to too small a buffer, null length argument",	3, 2, false	},
			{ "Query to zero sized buffer, null length argument",	3, 0, false	},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(querySizes); ++ndx)
		{
			const tcu::ScopedLogSection		section				(m_testCtx.getLog(), "QueryToLarger", querySizes[ndx].description);
			const glw::GLenum				props[]				= { GL_LOCATION, GL_LOCATION, GL_LOCATION };
			const int						expectedWriteLen	= de::min(querySizes[ndx].bufferSize, querySizes[ndx].numProps);
			int								params[]			= { 255, 255, 255, 255 };
			glw::GLsizei					written				= -1;

			DE_ASSERT(querySizes[ndx].numProps <= DE_LENGTH_OF_ARRAY(props));
			DE_ASSERT(querySizes[ndx].bufferSize < DE_LENGTH_OF_ARRAY(params)); // leave at least one element for overflow detection

			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Querying " << querySizes[ndx].numProps << " uniform prop(s) to a buffer with size " << querySizes[ndx].bufferSize << ". Expecting query to return " << expectedWriteLen << " prop(s)"
				<< tcu::TestLog::EndMessage;

			gl.getProgramResourceiv(program.getProgram(), GL_UNIFORM, uniformIndex, querySizes[ndx].numProps, props, querySizes[ndx].bufferSize, (querySizes[ndx].returnLength) ? (&written) : (DE_NULL), params);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query program resources");

			if (querySizes[ndx].returnLength && written != expectedWriteLen)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected write length of " << expectedWriteLen << ", got " << written << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected write lenght");
			}
			else if (params[expectedWriteLen] != 255)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, guard at index " << (expectedWriteLen) << " was modified. Was 255 before call, got dec=" << params[expectedWriteLen] << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Wrote over buffer size");
			}
		}
	}

	return STOP;
}